

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

void __thiscall
QAbstractItemView::currentChanged
          (QAbstractItemView *this,QModelIndex *current,QModelIndex *previous)

{
  uint uVar1;
  Int IVar2;
  bool bVar3;
  WidgetAttribute attribute;
  Int IVar4;
  int iVar5;
  int iVar6;
  QAbstractItemViewPrivate *pQVar7;
  QWidget *pQVar8;
  QModelIndex *in_RDX;
  QModelIndex *in_RSI;
  QAbstractItemViewPrivate *in_RDI;
  long in_FS_OFFSET;
  byte bVar9;
  bool rowChanged;
  QAbstractItemViewPrivate *d;
  SelectionFlags command;
  QModelIndex newCurrent;
  QWidget *editor;
  QModelIndex buddy;
  QPersistentModelIndex persistentCurrent;
  undefined4 in_stack_ffffffffffffff48;
  ItemFlag in_stack_ffffffffffffff4c;
  QModelIndex *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  QAbstractItemViewPrivate *this_00;
  QFlagsStorageHelper<Qt::ItemFlag,_4> local_6c;
  QPersistentModelIndex local_68 [3];
  QFlags local_50 [3];
  QPersistentModelIndex this_01;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  QPersistentModelIndex local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  pQVar7 = d_func((QAbstractItemView *)0x80f1aa);
  local_10.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
  QPersistentModelIndex::QPersistentModelIndex(&local_10,(QModelIndex *)in_RSI);
  bVar3 = QModelIndex::isValid(in_stack_ffffffffffffff50);
  if (bVar3) {
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    (**(code **)(*(long *)pQVar7->model + 0x148))(&local_28,pQVar7->model,in_RDX);
    QAbstractItemViewPrivate::editorForIndex
              ((QAbstractItemViewPrivate *)
               CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),(QModelIndex *)in_RDI);
    pQVar8 = QPointer<QWidget>::data((QPointer<QWidget> *)0x80f24c);
    bVar3 = QWidget::isVisible((QWidget *)0x80f25e);
    if (bVar3) {
      update((QAbstractItemView *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
             in_stack_ffffffffffffff50);
    }
    if ((pQVar8 != (QWidget *)0x0) &&
       (bVar3 = QSet<QWidget_*>::contains
                          ((QSet<QWidget_*> *)in_stack_ffffffffffffff50,
                           (QWidget **)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)
                          ), !bVar3)) {
      in_stack_ffffffffffffff5c = QModelIndex::row(in_RSI);
      iVar5 = QModelIndex::row(in_RDX);
      bVar9 = in_stack_ffffffffffffff5c != iVar5;
      (**(code **)(*(long *)&(in_RDI->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                             super_QWidgetPrivate + 0x298))(in_RDI,pQVar8);
      if ((bVar9 & 1) == 0) {
        (**(code **)(*(long *)&(in_RDI->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                               super_QWidgetPrivate + 0x290))(in_RDI,pQVar8,0);
      }
      else {
        (**(code **)(*(long *)&(in_RDI->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                               super_QWidgetPrivate + 0x290))(in_RDI,pQVar8,3);
      }
    }
  }
  this_01.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
  QPersistentModelIndex::operator_cast_to_QModelIndex
            ((QPersistentModelIndex *)&stack0xffffffffffffffb8);
  attribute = (**(code **)(*(long *)&(in_RDI->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                                     super_QWidgetPrivate + 0x2e8))
                        (in_RDI,&stack0xffffffffffffffb8,0);
  _local_50 = (Int)QFlags<QItemSelectionModel::SelectionFlag>::operator&
                             ((QFlags<QItemSelectionModel::SelectionFlag> *)
                              in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
  IVar4 = ::QFlags::operator_cast_to_unsigned_int(local_50);
  if (IVar4 == 0) {
    QPersistentModelIndex::operator=
              (&pQVar7->currentSelectionStartIndex,(QModelIndex *)&stack0xffffffffffffffb8);
  }
  bVar3 = QModelIndex::isValid(in_stack_ffffffffffffff50);
  if ((bVar3) && (bVar3 = QBasicTimer::isActive(&pQVar7->autoScrollTimer), !bVar3)) {
    bVar3 = QWidget::isVisible((QWidget *)0x80f3ea);
    if (bVar3) {
      if ((pQVar7->autoScroll & 1U) != 0) {
        (**(code **)(*(long *)&(in_RDI->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                               super_QWidgetPrivate + 0x1e8))(in_RDI,&stack0xffffffffffffffb8,0);
      }
      update((QAbstractItemView *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
             in_stack_ffffffffffffff50);
      (**(code **)(*(long *)&(in_RDI->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                             super_QWidgetPrivate + 0x2e0))(in_RDI,&stack0xffffffffffffffb8,1,0);
      iVar5 = QModelIndex::row((QModelIndex *)&stack0xffffffffffffffb8);
      in_stack_ffffffffffffff50 = (QModelIndex *)pQVar7->model;
      QPersistentModelIndex::operator_cast_to_QModelIndex(local_68);
      iVar6 = (**(code **)(*(long *)in_stack_ffffffffffffff50 + 0x78))
                        (in_stack_ffffffffffffff50,local_68);
      if (iVar5 == iVar6 + -1) {
        QAbstractItemViewPrivate::fetchMore(this_00);
      }
    }
    else {
      pQVar7->shouldScrollToCurrentOnShow = (bool)(pQVar7->autoScroll & 1);
    }
  }
  bVar3 = QModelIndex::isValid(in_stack_ffffffffffffff50);
  in_stack_ffffffffffffff4c = in_stack_ffffffffffffff4c & 0xffffff;
  if (bVar3) {
    QModelIndex::flags(in_stack_ffffffffffffff50);
    local_6c.super_QFlagsStorage<Qt::ItemFlag>.i =
         (QFlagsStorage<Qt::ItemFlag>)
         QFlags<Qt::ItemFlag>::operator&
                   ((QFlags<Qt::ItemFlag> *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_6c);
  }
  IVar2 = _local_50;
  uVar1 = _local_50 >> 0x18;
  bVar3 = SUB41(uVar1,0);
  _local_50 = IVar2;
  QWidget::setAttribute((QWidget *)this_01.d,attribute,bVar3);
  QPersistentModelIndex::~QPersistentModelIndex(&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractItemView::currentChanged(const QModelIndex &current, const QModelIndex &previous)
{
    Q_D(QAbstractItemView);
    Q_ASSERT(d->model);

    QPersistentModelIndex persistentCurrent(current); // in case commitData() moves things around (QTBUG-127852)

    if (previous.isValid()) {
        QModelIndex buddy = d->model->buddy(previous);
        QWidget *editor = d->editorForIndex(buddy).widget.data();
        if (isVisible()) {
            update(previous);
        }
        if (editor && !d->persistent.contains(editor)) {
            const bool rowChanged = current.row() != previous.row();
            commitData(editor); // might invalidate previous, don't use after this line (QTBUG-127852)
            if (rowChanged)
                closeEditor(editor, QAbstractItemDelegate::SubmitModelCache);
            else
                closeEditor(editor, QAbstractItemDelegate::NoHint);
        }
    }

    const QModelIndex newCurrent = persistentCurrent;

    QItemSelectionModel::SelectionFlags command = selectionCommand(newCurrent, nullptr);
    if ((command & QItemSelectionModel::Current) == 0)
        d->currentSelectionStartIndex = newCurrent;

    if (newCurrent.isValid() && !d->autoScrollTimer.isActive()) {
        if (isVisible()) {
            if (d->autoScroll)
                scrollTo(newCurrent);
            update(newCurrent);
            edit(newCurrent, CurrentChanged, nullptr);
            if (newCurrent.row() == (d->model->rowCount(d->root) - 1))
                d->fetchMore();
        } else {
            d->shouldScrollToCurrentOnShow = d->autoScroll;
        }
    }
    setAttribute(Qt::WA_InputMethodEnabled, (newCurrent.isValid() && (newCurrent.flags() & Qt::ItemIsEditable)));
}